

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# placalc.cpp
# Opt level: O2

void placalc::LoadPostLossAmplificationFactors(float secondaryFactor)

{
  float fVar1;
  FILE *__stream;
  size_t sVar2;
  mapped_type *pmVar3;
  int iVar4;
  bool bVar5;
  event_amplification ea;
  amplification_factor af;
  event_count ec;
  int opts;
  
  __stream = fopen("static/lossfactors.bin","rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: %s: Error opening file %s\n","LoadPostLossAmplificationFactors",
            "static/lossfactors.bin");
    exit(1);
  }
  sVar2 = fread(&opts,4,1,__stream);
  do {
    if (sVar2 == 0) {
      return;
    }
    sVar2 = fread(&ec,8,1,__stream);
    if (sVar2 == 0) {
      return;
    }
    ea.event_id = ec.event_id;
    iVar4 = ec.count;
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      sVar2 = fread(&af,8,1,__stream);
      if (sVar2 == 0) {
        sVar2 = 0;
        break;
      }
      ea.amplification_id = af.amplification_id;
      fVar1 = af.factor + -1.0;
      pmVar3 = std::__detail::
               _Map_base<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)factors_,&ea);
      *pmVar3 = fVar1 * secondaryFactor + 1.0;
    }
  } while( true );
}

Assistant:

void LoadPostLossAmplificationFactors(const float secondaryFactor) {

    FILE *fin = fopen(PLAFACTORS_FILE, "rb");
    if (fin == nullptr) {
      fprintf(stderr, "FATAL: %s: Error opening file %s\n", __func__,
	      PLAFACTORS_FILE);
      exit(EXIT_FAILURE);
    }

    int opts;
    size_t i = fread(&opts, sizeof(opts), 1, fin);

    event_count ec;
    amplification_factor af;
    while (i != 0) {
      i = fread(&ec, sizeof(ec), 1, fin);
      if (i == 0) break;
      event_amplification ea;
      ea.event_id = ec.event_id;
      for (int amplification = 0; amplification != ec.count; ++amplification) {
	i = fread(&af, sizeof(af), 1, fin);
	if (i == 0) break;
	ea.amplification_id = af.amplification_id;
	factors_[ea] = 1. + (af.factor - 1.) * secondaryFactor;
      }
    }

  }